

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

int feat_set_subvecs(feat_t *fcb,int32 **subvecs)

{
  int iVar1;
  int32 **ppiVar2;
  uint32 *puVar3;
  mfcc_t *pmVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  uint32 uVar8;
  uint uVar9;
  
  if (subvecs == (int32 **)0x0) {
    subvecs_free(fcb->subvecs);
    ckd_free(fcb->sv_buf);
    ckd_free(fcb->sv_len);
    *(undefined8 *)((long)&fcb->subvecs + 4) = 0;
    *(undefined8 *)((long)&fcb->sv_buf + 4) = 0;
    *(undefined8 *)&fcb->n_sv = 0;
    *(undefined8 *)((long)&fcb->sv_len + 4) = 0;
LAB_001137d1:
    iVar1 = 0;
  }
  else {
    if (fcb->n_stream == 1) {
      piVar6 = *subvecs;
      if (piVar6 == (int *)0x0) {
        uVar9 = 0;
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        uVar9 = 0;
        ppiVar2 = subvecs;
        do {
          iVar1 = *piVar6;
          while (iVar1 != -1) {
            piVar6 = piVar6 + 1;
            uVar7 = uVar7 + 1;
            iVar1 = *piVar6;
          }
          uVar9 = uVar9 + 1;
          piVar6 = ppiVar2[1];
          ppiVar2 = ppiVar2 + 1;
        } while (piVar6 != (int *)0x0);
      }
      if (uVar7 <= fcb->out_dim) {
        fcb->n_sv = uVar9;
        fcb->subvecs = subvecs;
        puVar3 = (uint32 *)
                 __ckd_calloc__((ulong)uVar9,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x13d);
        fcb->sv_len = puVar3;
        pmVar4 = (mfcc_t *)
                 __ckd_calloc__((ulong)uVar7,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x13e);
        fcb->sv_buf = pmVar4;
        fcb->sv_dim = uVar7;
        if (uVar9 != 0) {
          uVar5 = 0;
          do {
            piVar6 = subvecs[uVar5];
            if ((piVar6 != (int *)0x0) && (*piVar6 != -1)) {
              puVar3 = fcb->sv_len;
              uVar8 = puVar3[uVar5];
              do {
                uVar8 = uVar8 + 1;
                piVar6 = piVar6 + 1;
                puVar3[uVar5] = uVar8;
              } while (*piVar6 != -1);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar9);
        }
        goto LAB_001137d1;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x137,
              "Total dimensionality of subvector specification %d > feature dimensionality %d\n",
              (ulong)uVar7);
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x127,"Subvector specifications require single-stream features!");
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
feat_set_subvecs(feat_t *fcb, int32 **subvecs)
{
    int32 **sv;
    uint32 n_sv, n_dim, i;

    if (subvecs == NULL) {
        subvecs_free(fcb->subvecs);
        ckd_free(fcb->sv_buf);
        ckd_free(fcb->sv_len);
        fcb->n_sv = 0;
        fcb->subvecs = NULL;
        fcb->sv_len = NULL;
        fcb->sv_buf = NULL;
        fcb->sv_dim = 0;
        return 0;
    }

    if (fcb->n_stream != 1) {
        E_ERROR("Subvector specifications require single-stream features!");
        return -1;
    }

    n_sv = 0;
    n_dim = 0;
    for (sv = subvecs; sv && *sv; ++sv) {
        int32 *d;

        for (d = *sv; d && *d != -1; ++d) {
            ++n_dim;
        }
        ++n_sv;
    }
    if (n_dim > feat_dimension(fcb)) {
        E_ERROR("Total dimensionality of subvector specification %d "
                "> feature dimensionality %d\n", n_dim, feat_dimension(fcb));
        return -1;
    }

    fcb->n_sv = n_sv;
    fcb->subvecs = subvecs;
    fcb->sv_len = (uint32 *)ckd_calloc(n_sv, sizeof(*fcb->sv_len));
    fcb->sv_buf = (mfcc_t *)ckd_calloc(n_dim, sizeof(*fcb->sv_buf));
    fcb->sv_dim = n_dim;
    for (i = 0; i < n_sv; ++i) {
        int32 *d;
        for (d = subvecs[i]; d && *d != -1; ++d) {
            ++fcb->sv_len[i];
        }
    }

    return 0;
}